

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13ef60::CpuIndexedIndirectTest_rra_sets_carry_Test::TestBody
          (CpuIndexedIndirectTest_rra_sets_carry_Test *this)

{
  (this->super_CpuIndexedIndirectTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuIndexedIndirectTest).super_CpuTest.registers.a = 0xc0;
  (this->super_CpuIndexedIndirectTest).super_CpuTest.expected.a = '\n';
  (this->super_CpuIndexedIndirectTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuIndexedIndirectTest).super_CpuTest.field_0x114 = 0x94;
  CpuIndexedIndirectTest::run_readwrite_instruction(&this->super_CpuIndexedIndirectTest,'c','J');
  return;
}

Assistant:

TEST_F(CpuIndexedIndirectTest, rra_sets_carry) {
    registers.p = Z_FLAG;
    registers.a = 0b1100'0000;
    expected.a = 0b0000'1010;
    expected.p = C_FLAG;
    memory_content = 0b1001'0100;
    run_readwrite_instruction(RRA_INXIND, 0b0100'1010);
}